

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::TuplePrefixPrinter<2ul>::
     TersePrintPrefixToStrings<std::tuple<mp::expr::Kind,mp::LogicalCountExpr>>
               (tuple<mp::expr::Kind,_mp::LogicalCountExpr> *t,Strings *strings)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  stringstream ss;
  value_type *in_stack_fffffffffffffe18;
  LogicalCountExpr *in_stack_fffffffffffffe20;
  string local_1c8 [48];
  stringstream local_198 [384];
  Strings *in_stack_ffffffffffffffe8;
  
  TuplePrefixPrinter<1ul>::
  TersePrintPrefixToStrings<std::tuple<mp::expr::Kind,mp::LogicalCountExpr>>
            ((tuple<mp::expr::Kind,_mp::LogicalCountExpr> *)in_RSI,in_stack_ffffffffffffffe8);
  std::__cxx11::stringstream::stringstream(local_198);
  std::get<1ul,mp::expr::Kind,mp::LogicalCountExpr>
            ((tuple<mp::expr::Kind,_mp::LogicalCountExpr> *)0x1daad3);
  UniversalTersePrint<mp::LogicalCountExpr>
            (in_stack_fffffffffffffe20,(ostream *)in_stack_fffffffffffffe18);
  std::__cxx11::stringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_RSI,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

static void TersePrintPrefixToStrings(const Tuple& t, Strings* strings) {
    TuplePrefixPrinter<N - 1>::TersePrintPrefixToStrings(t, strings);
    ::std::stringstream ss;
    UniversalTersePrint(::std::tr1::get<N - 1>(t), &ss);
    strings->push_back(ss.str());
  }